

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall
QHttpNetworkRequest::setUploadByteDevice(QHttpNetworkRequest *this,QNonContiguousByteDevice *bd)

{
  QHttpNetworkRequestPrivate *pQVar1;
  QNonContiguousByteDevice *in_RSI;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)in_RSI);
  pQVar1->uploadByteDevice = in_RSI;
  return;
}

Assistant:

void QHttpNetworkRequest::setUploadByteDevice(QNonContiguousByteDevice *bd)
{
    d->uploadByteDevice = bd;
}